

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O3

spv_result_t spvtools::val::CompositesPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  int32_t iVar5;
  uint uVar6;
  uint32_t uVar7;
  spv_result_t sVar8;
  uint32_t uVar9;
  uint uVar10;
  Op OVar11;
  uint32_t uVar12;
  Instruction *pIVar13;
  Instruction *pIVar14;
  Instruction *pIVar15;
  DiagnosticStream *pDVar16;
  uint uVar17;
  uint *puVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  char *pcVar22;
  size_t operand_index;
  size_t sVar23;
  uint32_t member_type;
  uint32_t result_num_cols;
  uint32_t result_component_type;
  uint32_t matrix_component_type;
  uint32_t matrix_num_cols;
  uint32_t matrix_num_rows;
  uint32_t result_num_rows;
  uint32_t matrix_col_type;
  uint32_t local_25c;
  char *local_258;
  uint32_t local_24c;
  uint32_t local_248;
  uint local_244;
  uint32_t local_240;
  uint32_t local_23c;
  uint32_t local_238;
  uint32_t local_234;
  string local_230;
  uint32_t local_20c;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  uVar17 = uVar1 - 0x4d;
  if (7 < uVar17) {
    if (uVar1 != 400) {
      return SPV_SUCCESS;
    }
    pIVar13 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar14 = ValidationState_t::FindDef(_,uVar17);
    pIVar14 = ValidationState_t::FindDef(_,(pIVar14->inst_).type_id);
    if (((pIVar14 == pIVar13) || (pIVar13 == (Instruction *)0x0)) || (pIVar14 == (Instruction *)0x0)
       ) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar22 = "Result Type must not equal the Operand type";
LAB_00616026:
      lVar20 = 0x2b;
    }
    else {
      bVar4 = ValidationState_t::LogicallyMatch(_,pIVar14,pIVar13,false);
      if (!bVar4) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar22 = "Result Type does not logically match the Operand type";
        goto LAB_00616212;
      }
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Cannot copy composites of 8- or 16-bit types";
      lVar20 = 0x2c;
    }
    goto LAB_006169b1;
  }
  puVar18 = (uint *)((long)&switchD_006157eb::switchdataD_008eadc4 +
                    (long)(int)(&switchD_006157eb::switchdataD_008eadc4)[uVar17]);
  switch((uint)uVar1) {
  case 0x4d:
    uVar7 = (inst->inst_).type_id;
    OVar11 = ValidationState_t::GetIdOpcode(_,uVar7);
    iVar5 = spvOpcodeIsScalarType(OVar11);
    if (iVar5 == 0) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Expected Result Type to be a scalar type";
LAB_00616173:
      lVar20 = 0x28;
    }
    else {
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar11 = ValidationState_t::GetIdOpcode(_,uVar9);
      if ((OVar11 != OpTypeVector) && (OVar11 != OpTypeCooperativeVectorNV)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Expected Vector type to be OpTypeVector";
        goto LAB_00616288;
      }
      uVar9 = ValidationState_t::GetComponentType(_,uVar9);
      if (uVar9 == uVar7) {
        uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar13 = ValidationState_t::FindDef(_,uVar17);
        if (((pIVar13 == (Instruction *)0x0) || (uVar7 = (pIVar13->inst_).type_id, uVar7 == 0)) ||
           (bVar4 = ValidationState_t::IsIntScalarType(_,uVar7), !bVar4)) {
LAB_006161ca:
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar22 = "Expected Index to be int scalar";
          lVar20 = 0x1f;
        }
        else {
          bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar22 = "Cannot extract from a vector of 8- or 16-bit types";
          lVar20 = 0x32;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Expected Vector component type to be equal to Result Type";
        lVar20 = 0x39;
      }
    }
    break;
  case 0x4e:
    uVar7 = (inst->inst_).type_id;
    OVar11 = ValidationState_t::GetIdOpcode(_,uVar7);
    if ((OVar11 == OpTypeVector) || (OVar11 == OpTypeCooperativeVectorNV)) {
      uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
      if (uVar9 == uVar7) {
        uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
        uVar7 = ValidationState_t::GetComponentType(_,uVar7);
        if (uVar7 == uVar9) {
          uVar7 = ValidationState_t::GetOperandTypeId(_,inst,4);
          bVar4 = ValidationState_t::IsIntScalarType(_,uVar7);
          if (!bVar4) goto LAB_006161ca;
          bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar22 = "Cannot insert into a vector of 8- or 16-bit types";
          lVar20 = 0x31;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected Component type to be equal to Result Type ",0x33
                    );
          pcVar22 = "component type";
          lVar20 = 0xe;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Expected Vector type to be equal to Result Type";
LAB_0061619c:
        lVar20 = 0x2f;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Expected Result Type to be OpTypeVector";
LAB_00616288:
      lVar20 = 0x27;
    }
    break;
  case 0x4f:
    pIVar13 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Result Type of OpVectorShuffle must be",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," OpTypeVector. Found Op",0x17);
      local_230._M_dataplus._M_p = spvOpcodeString((uint)(pIVar13->inst_).opcode);
      pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,".",1);
      local_38 = pDVar16->error_;
      goto LAB_006169c3;
    }
    psVar2 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    psVar3 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
    if (((long)psVar2 - (long)psVar3 >> 4) - 4U != (ulong)uVar17) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "OpVectorShuffle component literals count does not match Result Type <id> ",0x49);
      ValidationState_t::getIdName_abi_cxx11_(&local_230,_,(pIVar13->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"s vector component count.",0x19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      goto LAB_006169c3;
    }
    uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar14 = ValidationState_t::FindDef(_,uVar17);
    pIVar14 = ValidationState_t::FindDef(_,(pIVar14->inst_).type_id);
    uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    pIVar15 = ValidationState_t::FindDef(_,uVar17);
    pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar22 = "The type of Vector 1 must be OpTypeVector.";
    }
    else {
      if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).opcode == 0x17)) {
        uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
        uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        if (uVar10 == uVar17) {
          uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
          if (uVar10 == uVar17) {
            uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
            uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
            if (0x40 < (ulong)((long)(inst->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              sVar23 = 4;
              do {
                uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,sVar23);
                if ((uVar6 != 0xffffffff) && (uVar10 + uVar17 <= uVar6)) {
                  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"Component index ",0x10);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," is out of bounds for ",0x16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"combined (Vector1 + Vector2) size of ",0x25);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
                  goto LAB_006169c3;
                }
                sVar23 = sVar23 + 1;
              } while (sVar23 < (ulong)((long)(inst->operands_).
                                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(inst->operands_).
                                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
            if (!bVar4) {
              return SPV_SUCCESS;
            }
            bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
            if (!bVar4) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar22 = "Cannot shuffle a vector of 8- or 16-bit types";
            lVar20 = 0x2d;
            break;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar22 = "The Component Type of Vector 2 must be the same as ResultType.";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar22 = "The Component Type of Vector 1 must be the same as ResultType.";
        }
        lVar20 = 0x3e;
        break;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar22 = "The type of Vector 2 must be OpTypeVector.";
    }
    goto LAB_00616972;
  case 0x50:
    uVar21 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    uVar7 = (inst->inst_).type_id;
    OVar11 = ValidationState_t::GetIdOpcode(_,uVar7);
    uVar17 = (uint)uVar21;
    if ((int)OVar11 < 0x1168) {
      puVar18 = &switchD_00615c21::switchdataD_008eade4;
      switch(OVar11) {
      case OpTypeVector:
switchD_00615c21_caseD_17:
        uVar9 = ValidationState_t::GetDimension(_,uVar7);
        local_24c = ValidationState_t::GetComponentType(_,uVar7);
        if (OVar11 == OpTypeVector) {
          if (uVar17 < 4) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar22 = "Expected number of constituents to be at least 2";
            lVar20 = 0x30;
            goto LAB_006169b1;
          }
          uVar10 = 0;
          local_208._0_4_ = uVar9;
LAB_006167da:
          uVar7 = 0;
          sVar23 = 2;
          local_244 = uVar10;
          local_240 = local_208._0_4_;
          do {
            uVar9 = ValidationState_t::GetOperandTypeId(_,inst,sVar23);
            uVar12 = 1;
            if (uVar9 != local_24c) {
              OVar11 = ValidationState_t::GetIdOpcode(_,uVar9);
              if ((OVar11 != OpTypeVector) ||
                 (uVar12 = ValidationState_t::GetComponentType(_,uVar9), uVar12 != local_24c)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"Expected Constituents to be scalars or vectors of",
                           0x31);
                pcVar22 = " the same type as Result Type components";
                goto LAB_00616173;
              }
              uVar12 = ValidationState_t::GetDimension(_,uVar9);
            }
            uVar7 = uVar7 + uVar12;
            sVar23 = sVar23 + 1;
          } while ((uVar21 & 0xffffffff) != sVar23);
          uVar19 = (ulong)local_244;
          local_208._0_4_ = local_240;
        }
        else {
          pIVar13 = ValidationState_t::FindDef(_,uVar7);
          uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
          ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar10)
          ;
          uVar19 = CONCAT71((int7)((ulong)puVar18 >> 8),local_208[4]) ^ 1;
          uVar10 = (uint)uVar19;
          uVar7 = 0;
          if (2 < uVar17) goto LAB_006167da;
        }
        if (((char)uVar19 == '\0') && (local_208._0_4_ != uVar7)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected total number of given components to be equal ",
                     0x36);
          pcVar22 = "to the size of Result Type vector";
          lVar20 = 0x21;
          goto LAB_006169b1;
        }
        break;
      case OpTypeMatrix:
        local_230._M_dataplus._M_p = local_230._M_dataplus._M_p & 0xffffffff00000000;
        local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
        local_25c = 0;
        local_248 = 0;
        bVar4 = ValidationState_t::GetMatrixTypeInfo
                          (_,uVar7,(uint32_t *)&local_230,(uint32_t *)&local_258,&local_25c,
                           &local_248);
        if (!bVar4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x114,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((uint32_t)local_258 + 2 != uVar17) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected total number of Constituents to be equal ",0x32)
          ;
          pcVar22 = "to the number of columns of Result Type matrix";
LAB_006169ac:
          lVar20 = 0x2e;
          goto LAB_006169b1;
        }
        if (2 < uVar17) {
          sVar23 = 2;
          do {
            uVar7 = ValidationState_t::GetOperandTypeId(_,inst,sVar23);
            if (uVar7 != local_25c) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Expected Constituent type to be equal to the column "
                         ,0x34);
              pcVar22 = "type Result Type matrix";
              lVar20 = 0x17;
              goto LAB_006169b1;
            }
            sVar23 = sVar23 + 1;
          } while ((uVar21 & 0xffffffff) != sVar23);
        }
        break;
      default:
switchD_00615c21_caseD_19:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Expected Result Type to be a composite type";
        goto LAB_00616026;
      case OpTypeArray:
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if (pIVar13 == (Instruction *)0x0) {
          __assert_fail("array_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,299,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((pIVar13->inst_).opcode != 0x1c) {
          __assert_fail("array_inst->opcode() == spv::Op::OpTypeArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,300,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        pIVar14 = ValidationState_t::FindDef
                            (_,(pIVar13->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[3]);
        iVar5 = spvOpcodeIsSpecConstant((uint)(pIVar14->inst_).opcode);
        if (iVar5 == 0) {
          local_230._M_dataplus._M_p = (char *)0x0;
          bVar4 = ValidationState_t::EvalConstantValUint64
                            (_,(pIVar13->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[3],(uint64_t *)&local_230);
          if (!bVar4) {
            __assert_fail("0 && \"Array type definition is corrupt\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                          ,0x136,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                         );
          }
          if (local_230._M_dataplus._M_p + 2 != (char *)(uVar21 & 0xffffffff)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Expected total number of Constituents to be equal ",
                       0x32);
            pcVar22 = "to the number of elements of Result Type array";
            goto LAB_006169ac;
          }
          if (2 < uVar17) {
            uVar7 = (pIVar13->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[2];
            pcVar22 = (char *)0x2;
            do {
              uVar9 = ValidationState_t::GetOperandTypeId(_,inst,(size_t)pcVar22);
              if (uVar9 != uVar7) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,
                           "Expected Constituent type to be equal to the column ",0x34);
                pcVar22 = "type Result Type array";
                lVar20 = 0x16;
                goto LAB_006169b1;
              }
              pcVar22 = pcVar22 + 1;
            } while ((char *)(uVar21 & 0xffffffff) != pcVar22);
          }
        }
        break;
      case OpTypeStruct:
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if (pIVar13 == (Instruction *)0x0) {
          __assert_fail("struct_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x14e,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((pIVar13->inst_).opcode != 0x1e) {
          __assert_fail("struct_inst->opcode() == spv::Op::OpTypeStruct",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x14f,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        sVar23 = (long)(pIVar13->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pIVar13->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        if (sVar23 + 1 != (uVar21 & 0xffffffff)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected total number of Constituents to be equal ",0x32)
          ;
          pcVar22 = "to the number of members of Result Type struct";
          goto LAB_006169ac;
        }
        if (2 < uVar17) {
          operand_index = 2;
          do {
            uVar7 = ValidationState_t::GetOperandTypeId(_,inst,operand_index);
            if (uVar7 != (pIVar13->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[operand_index]) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Expected Constituent type to be equal to the ",0x2d);
              pcVar22 = "corresponding member type of Result Type struct";
              goto LAB_0061619c;
            }
            bVar4 = operand_index != sVar23;
            operand_index = operand_index + 1;
          } while (bVar4);
        }
      }
LAB_00616898:
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Cannot create a composite containing 8- or 16-bit types";
      lVar20 = 0x37;
    }
    else if (OVar11 == OpTypeCooperativeMatrixKHR) {
      pIVar13 = ValidationState_t::FindDef(_,uVar7);
      if (pIVar13 == (Instruction *)0x0) {
        __assert_fail("result_type_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x166,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
      if (uVar17 == 3) {
LAB_006165f3:
        uVar7 = ValidationState_t::GetOperandTypeId(_,inst,2);
        if (uVar7 == uVar10) goto LAB_00616898;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Expected Constituent type to be equal to the component type";
        lVar20 = 0x3b;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Must be only one constituent";
        lVar20 = 0x1c;
      }
    }
    else {
      if (OVar11 != OpTypeCooperativeMatrixNV) {
        if (OVar11 != OpTypeCooperativeVectorNV) goto switchD_00615c21_caseD_19;
        goto switchD_00615c21_caseD_17;
      }
      pIVar13 = ValidationState_t::FindDef(_,uVar7);
      if (pIVar13 == (Instruction *)0x0) {
        __assert_fail("result_type_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                      ,0x179,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                     );
      }
      uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
      if (uVar17 == 3) goto LAB_006165f3;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Expected single constituent";
      lVar20 = 0x1b;
    }
    break;
  case 0x51:
    local_25c = 0;
    sVar8 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_25c);
    uVar9 = local_25c;
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = (inst->inst_).type_id;
    if (uVar7 != local_25c) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Result type (Op",0xf)
      ;
      OVar11 = ValidationState_t::GetIdOpcode(_,uVar7);
      local_230._M_dataplus._M_p = spvOpcodeString(OVar11);
      pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
      pcVar22 = ") does not match the type that results from indexing into the composite (Op";
LAB_00616715:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,pcVar22,0x4b);
      OVar11 = ValidationState_t::GetIdOpcode(_,uVar9);
      local_258 = spvOpcodeString(OVar11);
      pDVar16 = DiagnosticStream::operator<<(pDVar16,&local_258);
      pcVar22 = ").";
      lVar20 = 2;
      goto LAB_00616755;
    }
    bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = "Cannot extract from a composite of 8- or 16-bit types";
LAB_00616212:
    lVar20 = 0x35;
    break;
  case 0x52:
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,2);
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if ((inst->inst_).type_id == uVar9) {
      local_25c = 0;
      sVar8 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_25c);
      uVar9 = local_25c;
      if (sVar8 != SPV_SUCCESS) {
        return sVar8;
      }
      if (uVar7 == local_25c) {
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar4) {
          return SPV_SUCCESS;
        }
        bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar4) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Cannot insert into a composite of 8- or 16-bit types";
        goto LAB_006160ca;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Object type (Op",0x13);
      OVar11 = ValidationState_t::GetIdOpcode(_,uVar7);
      local_230._M_dataplus._M_p = spvOpcodeString(OVar11);
      pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
      pcVar22 = ") does not match the type that results from indexing into the Composite (Op";
      goto LAB_00616715;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"The Result Type must be the same as Composite type in Op",0x38)
    ;
    local_230._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar16," yielding Result Id ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
    pcVar22 = ".";
    lVar20 = 1;
LAB_00616755:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,pcVar22,lVar20);
    local_38 = pDVar16->error_;
    goto LAB_006169c3;
  case 0x53:
    uVar7 = (inst->inst_).type_id;
    uVar9 = ValidationState_t::GetOperandTypeId(_,inst,2);
    if (uVar9 == uVar7) {
      bVar4 = ValidationState_t::IsVoidType(_,uVar7);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "OpCopyObject cannot have void result type";
LAB_006166b3:
      lVar20 = 0x29;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Expected Result Type and Operand type to be the same";
LAB_006160ca:
      lVar20 = 0x34;
    }
    break;
  case 0x54:
    local_230._M_dataplus._M_p = local_230._M_dataplus._M_p & 0xffffffff00000000;
    local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
    local_25c = 0;
    local_248 = 0;
    bVar4 = ValidationState_t::GetMatrixTypeInfo
                      (_,(inst->inst_).type_id,(uint32_t *)&local_230,(uint32_t *)&local_258,
                       &local_25c,&local_248);
    if (!bVar4) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Expected Result Type to be a matrix type";
      goto LAB_00616173;
    }
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,2);
    local_234 = 0;
    local_238 = 0;
    local_20c = 0;
    local_23c = 0;
    bVar4 = ValidationState_t::GetMatrixTypeInfo
                      (_,uVar7,&local_234,&local_238,&local_20c,&local_23c);
    if (bVar4) {
      if (local_248 != local_23c) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Expected component types of Matrix and Result Type to be ",
                   0x39);
        pcVar22 = "identical";
        lVar20 = 9;
        break;
      }
      if (((uint32_t)local_230._M_dataplus._M_p != local_238) || ((uint32_t)local_258 != local_234))
      {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Expected number of columns and the column size of Matrix ",
                   0x39);
        pcVar22 = "to be the reverse of those of Result Type";
        goto LAB_006166b3;
      }
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      bVar4 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Cannot transpose matrices of 16-bit floats";
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "Expected Matrix to be of type OpTypeMatrix";
    }
LAB_00616972:
    lVar20 = 0x2a;
  }
LAB_006169b1:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar22,lVar20);
LAB_006169c3:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t CompositesPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVectorExtractDynamic:
      return ValidateVectorExtractDynamic(_, inst);
    case spv::Op::OpVectorInsertDynamic:
      return ValidateVectorInsertDyanmic(_, inst);
    case spv::Op::OpVectorShuffle:
      return ValidateVectorShuffle(_, inst);
    case spv::Op::OpCompositeConstruct:
      return ValidateCompositeConstruct(_, inst);
    case spv::Op::OpCompositeExtract:
      return ValidateCompositeExtract(_, inst);
    case spv::Op::OpCompositeInsert:
      return ValidateCompositeInsert(_, inst);
    case spv::Op::OpCopyObject:
      return ValidateCopyObject(_, inst);
    case spv::Op::OpTranspose:
      return ValidateTranspose(_, inst);
    case spv::Op::OpCopyLogical:
      return ValidateCopyLogical(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}